

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O3

void __thiscall tst_qpromise_operators::copy_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  PromiseDataBase<void,_void_()> *pPVar3;
  PromiseResolver<void> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar5;
  char cVar6;
  QObject *pQVar7;
  int *piVar8;
  QEvent *pQVar9;
  PromiseDataBase<void,_void_()> *this_00;
  _func_int **pp_Var10;
  char *pcVar11;
  char *pcVar12;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar13;
  bool bVar14;
  PromiseResolver<void> resolver_1;
  PromiseResolver<void> resolver;
  QPromise<void> p0;
  QPromise<void> local_78;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_68;
  int *local_58;
  QObject *local_50;
  _func_int **local_48;
  QPromiseBase<void> local_40;
  
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bae0;
  pQVar7 = (QObject *)operator_new(0x58);
  *(undefined8 *)pQVar7 = 0;
  *(undefined8 *)(pQVar7 + 8) = 0;
  *(undefined8 *)(pQVar7 + 0x10) = 0;
  *(undefined8 *)(pQVar7 + 0x18) = 0;
  *(undefined8 *)(pQVar7 + 0x20) = 0;
  *(undefined8 *)(pQVar7 + 0x28) = 0;
  *(undefined8 *)(pQVar7 + 0x30) = 0;
  *(undefined8 *)(pQVar7 + 0x38) = 0;
  *(undefined8 *)(pQVar7 + 0x40) = 0;
  *(undefined8 *)(pQVar7 + 0x48) = 0;
  *(undefined8 *)(pQVar7 + 0x50) = 0;
  *(undefined ***)pQVar7 = &PTR__PromiseDataBase_0011bb78;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(pQVar7 + 0x10),0);
  local_48 = (_func_int **)&PTR__PromiseDataBase_0011bb78;
  pQVar7[0x18] = (QObject)0x0;
  *(undefined8 *)(pQVar7 + 0x20) = 0;
  *(undefined8 *)(pQVar7 + 0x28) = 0;
  *(undefined8 *)(pQVar7 + 0x30) = 0;
  *(undefined8 *)(pQVar7 + 0x38) = 0;
  *(undefined8 *)(pQVar7 + 0x40) = 0;
  *(undefined8 *)(pQVar7 + 0x48) = 0;
  *(undefined8 *)(pQVar7 + 0x50) = 0;
  *(undefined ***)pQVar7 = &PTR__PromiseDataBase_0011bb00;
  LOCK();
  *(int *)(pQVar7 + 8) = *(int *)(pQVar7 + 8) + 1;
  UNLOCK();
  if (pQVar7 != (QObject *)0x0) {
    LOCK();
    *(int *)(pQVar7 + 8) = *(int *)(pQVar7 + 8) + 1;
    UNLOCK();
  }
  local_78.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  p0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pQVar7;
  local_78.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pQVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_78);
  local_68.d = (Data *)&PTR__QPromiseBase_0011bae0;
  local_78.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bae0;
  if ((QObject *)local_78.super_QPromiseBase<void>.m_d.d != (QObject *)0x0) {
    LOCK();
    pQVar1 = &((local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((QObject *)local_78.super_QPromiseBase<void>.m_d.d != (QObject *)0x0)) {
      (*((local_78.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  bVar14 = true;
  if (resolver.m_d.d == (Data *)0x0) {
LAB_00107238:
    QVar13.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) goto LAB_00107238;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar14 = false;
    QVar13 = resolver.m_d.d;
  }
  pQVar7 = (QObject *)QThread::currentThread();
  if ((pQVar7 != (QObject *)0x0) &&
     (piVar8 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7), local_58 = piVar8,
     local_50 = pQVar7, piVar8 != (int *)0x0)) {
    if ((piVar8[1] != 0) && (cVar6 = QThread::isFinished(), cVar6 == '\0')) {
      if (piVar8[1] == 0) {
        pQVar7 = (QObject *)(QThread *)0x0;
      }
      pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar7);
      if ((pQVar7 != (QObject *)0x0) || (cVar6 = QCoreApplication::closingDown(), cVar6 == '\0')) {
        pQVar9 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(pQVar9,None);
        *(undefined ***)pQVar9 = &PTR__Event_0011b960;
        *(Data **)(pQVar9 + 0x10) = QVar13.d;
        if (!bVar14) {
          LOCK();
          ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar7,pQVar9,0);
        piVar8 = local_58;
        if (local_58 == (int *)0x0) goto LAB_00107307;
      }
    }
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      piVar8 = local_58;
      if (local_58 == (int *)0x0) {
        piVar8 = (int *)0x0;
      }
      operator_delete(piVar8);
    }
  }
LAB_00107307:
  if (!bVar14) {
    LOCK();
    ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar13.d,0x10);
    }
    LOCK();
    ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar13.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar13.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba98;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = local_48;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  QVar13.d = local_68.d;
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011bb00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011ba98;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)QVar13.d;
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar2 = &this_00->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_00 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_00->_vptr_PromiseDataBase[1])();
    }
  }
  piVar8 = (int *)CONCAT71(resolver_1.m_d.d._1_7_,resolver_1.m_d.d._0_1_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  pQVar7 = (QObject *)QThread::currentThread();
  if ((pQVar7 != (QObject *)0x0) &&
     (pp_Var10 = (_func_int **)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7),
     local_78.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var10,
     local_78.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pQVar7,
     pp_Var10 != (_func_int **)0x0)) {
    if ((*(int *)((long)pp_Var10 + 4) != 0) && (cVar6 = QThread::isFinished(), cVar6 == '\0')) {
      if (*(int *)((long)pp_Var10 + 4) == 0) {
        pQVar7 = (QObject *)(QThread *)0x0;
      }
      pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar7);
      if ((pQVar7 != (QObject *)0x0) || (cVar6 = QCoreApplication::closingDown(), cVar6 == '\0')) {
        pQVar9 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(pQVar9,None);
        *(undefined ***)pQVar9 = &PTR__Event_0011b9a8;
        *(int **)(pQVar9 + 0x10) = piVar8;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar7,pQVar9,0);
        pp_Var10 = local_78.super_QPromiseBase<void>._vptr_QPromiseBase;
        if (local_78.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0)
        goto LAB_001074f8;
      }
    }
    LOCK();
    *(int *)pp_Var10 = *(int *)pp_Var10 + -1;
    UNLOCK();
    if (*(int *)pp_Var10 == 0) {
      pp_Var10 = local_78.super_QPromiseBase<void>._vptr_QPromiseBase;
      if (local_78.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
        pp_Var10 = (_func_int **)0x0;
      }
      operator_delete(pp_Var10);
    }
  }
LAB_001074f8:
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      operator_delete(piVar8,0x10);
    }
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      operator_delete(piVar8,0x10);
    }
  }
  piVar8 = (int *)CONCAT71(resolver_1.m_d.d._1_7_,resolver_1.m_d.d._0_1_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      operator_delete((void *)CONCAT71(resolver_1.m_d.d._1_7_,resolver_1.m_d.d._0_1_),0x10);
    }
  }
  bVar14 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> == this_00;
  resolver.m_d.d._0_1_ = bVar14;
  resolver_1.m_d.d._0_1_ = 0;
  pcVar11 = QTest::toString<bool>((bool *)&resolver);
  pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
  cVar6 = QTest::compare_helper
                    (!bVar14,"Compared values are not the same",pcVar11,pcVar12,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x82);
  if (cVar6 != '\0') {
    bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                       (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = bVar14;
    resolver_1.m_d.d._0_1_ = 1;
    pcVar11 = QTest::toString<bool>((bool *)&resolver);
    pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
    cVar6 = QTest::compare_helper
                      (bVar14,"Compared values are not the same",pcVar11,pcVar12,"p0.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x83);
    if (cVar6 != '\0') {
      bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      resolver.m_d.d._0_1_ = bVar14;
      resolver_1.m_d.d._0_1_ = 1;
      pcVar11 = QTest::toString<bool>((bool *)&resolver);
      pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
      cVar6 = QTest::compare_helper
                        (bVar14,"Compared values are not the same",pcVar11,pcVar12,"p1.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x84);
      if (cVar6 != '\0') {
        QVar5 = p0.super_QPromiseBase<void>.m_d;
        if (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> != this_00) {
          LOCK();
          (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          QVar5.d = (PromiseData<void> *)this_00;
          if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
            LOCK();
            pQVar2 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                      super_QSharedData;
            (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i == 0) {
              pPVar3 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
              p0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
              (*pPVar3->_vptr_PromiseDataBase[1])();
              QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
            }
          }
        }
        p0.super_QPromiseBase<void>.m_d.d = QVar5.d;
        QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
        resolver.m_d.d._0_1_ =
             &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> == this_00;
        resolver_1.m_d.d._0_1_ = 1;
        pcVar11 = QTest::toString<bool>((bool *)&resolver);
        pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
        cVar6 = QTest::compare_helper
                          (&(QVar5.d)->super_PromiseDataBase<void,_void_()> == this_00,
                           "Compared values are not the same",pcVar11,pcVar12,"p0 == p1","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x88);
        if (cVar6 != '\0') {
          bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                             (&(p0.super_QPromiseBase<void>.m_d.d)->
                               super_PromiseDataBase<void,_void_()>);
          resolver.m_d.d._0_1_ = bVar14;
          resolver_1.m_d.d._0_1_ = 1;
          pcVar11 = QTest::toString<bool>((bool *)&resolver);
          pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
          cVar6 = QTest::compare_helper
                            (bVar14,"Compared values are not the same",pcVar11,pcVar12,
                             "p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x89);
          if (cVar6 != '\0') {
            bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
            resolver.m_d.d._0_1_ = bVar14;
            resolver_1.m_d.d._0_1_ = 1;
            pcVar11 = QTest::toString<bool>((bool *)&resolver);
            pcVar12 = QTest::toString<bool>((bool *)&resolver_1);
            cVar6 = QTest::compare_helper
                              (bVar14,"Compared values are not the same",pcVar11,pcVar12,
                               "p1.isPending()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                               ,0x8a);
            if (cVar6 != '\0') {
              QtPromise::QPromiseBase<void>::wait(&local_40,&p0);
              local_40._vptr_QPromiseBase = (_func_int **)local_68.d;
              if (local_40.m_d.d != (PromiseData<void> *)0x0) {
                LOCK();
                pQVar2 = &((local_40.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData
                ;
                (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i =
                     (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int>._M_i == 0) &&
                   (local_40.m_d.d != (PromiseData<void> *)0x0)) {
                  (*((local_40.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase
                    [1])();
                }
              }
              QVar5.d = p0.super_QPromiseBase<void>.m_d.d;
              bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                                 (&(p0.super_QPromiseBase<void>.m_d.d)->
                                   super_PromiseDataBase<void,_void_()>);
              resolver.m_d.d._0_1_ =
                   ~bVar14 & ((QVar5.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                             _M_exception_object == (void *)0x0;
              resolver_1.m_d.d._0_1_ = 1;
              bVar14 = QTest::qCompare<bool,bool>
                                 ((bool *)&resolver,(bool *)&resolver_1,"p0.isFulfilled()","true",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                  ,0x8e);
              if (bVar14) {
                bVar14 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
                resolver.m_d.d._0_1_ =
                     ~bVar14 & (this_00->m_error).m_data._M_exception_object == (void *)0x0;
                resolver_1.m_d.d._0_1_ = 1;
                QTest::qCompare<bool,bool>
                          ((bool *)&resolver,(bool *)&resolver_1,"p1.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x8f);
              }
            }
          }
        }
      }
    }
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)local_68.d;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::move()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1), 42);

    p0 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1), 43);
}